

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_copy_img2comp(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int iVar1;
  fitsfile *in_RDX;
  fitsfile *in_RSI;
  int npat;
  char *patterns [12] [2];
  int bitpix;
  int tstatus;
  int jj;
  int ii;
  int nmore;
  int nkeys;
  char card2 [81];
  char card [81];
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 uVar4;
  char *in_stack_fffffffffffffe48;
  void *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe64;
  fitsfile *in_stack_fffffffffffffe68;
  int *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  fitsfile *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  fitsfile *in_stack_fffffffffffffea8;
  int *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  int local_f0;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  int iVar5;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  LONGLONG in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  fitsfile *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  char *(*in_stack_ffffffffffffff50) [2];
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  fitsfile *in_stack_ffffffffffffff60;
  fitsfile *in_stack_ffffffffffffff68;
  char local_78 [24];
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffd8;
  fitsfile *keyname;
  int local_4;
  
  memcpy(&stack0xfffffffffffffe48,&DAT_00292a00,0xc0);
  if (in_RDX->HDUposition < 1) {
    ffgcrd((fitsfile *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
           (char *)in_stack_ffffffffffffff50,
           (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
           in_stack_ffffffffffffff40);
    if (in_RDX->HDUposition != 0) {
      in_RDX->HDUposition = 0;
      strcpy(local_78,"EXTNAME = \'COMPRESSED_IMAGE\'");
      ffprec(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             &in_stack_fffffffffffffe98->HDUposition);
    }
    uVar4 = 0xc;
    uVar2 = 0;
    uVar3 = 0;
    keyname = in_RDX;
    fits_translate_keywords
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
    if (((in_RSI->Fptr->request_lossy_int_compress != 0) &&
        (ffgky(in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (int *)CONCAT44(uVar4,in_stack_fffffffffffffe40)), keyname->HDUposition < 1)) &&
       (0 < local_f0)) {
      ffmkyj(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (int *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      ffdkey(in_RSI,(char *)keyname,in_stack_ffffffffffffffd8);
      ffdkey(in_RSI,(char *)keyname,in_stack_ffffffffffffffd8);
      ffdkey(in_RSI,(char *)keyname,in_stack_ffffffffffffffd8);
    }
    iVar1 = ffgcrd((fitsfile *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   (char *)in_stack_ffffffffffffff50,
                   (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   in_stack_ffffffffffffff40);
    if (iVar1 == 0) {
      ffdkey(in_RSI,(char *)keyname,in_stack_ffffffffffffffd8);
      ffprec(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             &in_stack_fffffffffffffe98->HDUposition);
      ffpsvc(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             in_stack_fffffffffffffeb0);
      iVar1 = fits_strncasecmp((char *)in_RDX,(char *)CONCAT44(in_stack_fffffffffffffe34,uVar3),
                               CONCAT44(in_stack_fffffffffffffe2c,uVar2));
      if (iVar1 != 0) {
        ffphis(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        snprintf(&stack0xffffffffffffff28,0x51,"  q = %f / quantized level scaling parameter",
                 (double)in_RSI->Fptr->request_quantize_level);
        ffphis(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        ffphis(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      }
    }
    iVar1 = ffgcrd((fitsfile *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   (char *)in_stack_ffffffffffffff50,
                   (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   in_stack_ffffffffffffff40);
    if (iVar1 == 0) {
      ffdkey(in_RSI,(char *)keyname,in_stack_ffffffffffffffd8);
      ffprec(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             &in_stack_fffffffffffffe98->HDUposition);
    }
    ffghsp(in_RDX,(int *)CONCAT44(in_stack_fffffffffffffe34,uVar3),
           (int *)CONCAT44(in_stack_fffffffffffffe2c,uVar2),(int *)0x1ea6ac);
    in_stack_ffffffffffffff20 = in_stack_ffffffffffffff20 / 0x24;
    for (iVar1 = 0; iVar1 < in_stack_ffffffffffffff20; iVar1 = iVar1 + 1) {
      for (iVar5 = 0; iVar5 < 0x24; iVar5 = iVar5 + 1) {
        ffprec(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               &in_stack_fffffffffffffe98->HDUposition);
      }
    }
    local_4 = keyname->HDUposition;
  }
  else {
    local_4 = in_RDX->HDUposition;
  }
  return local_4;
}

Assistant:

int imcomp_copy_img2comp(fitsfile *infptr, fitsfile *outfptr, int *status)
/*
    This routine copies the header keywords from the uncompressed input image 
    and to the compressed image (in a binary table) 
*/
{
    char card[FLEN_CARD], card2[FLEN_CARD];	/* a header record */
    int nkeys, nmore, ii, jj, tstatus, bitpix;

    /* tile compressed image keyword translation table  */
    /*                        INPUT      OUTPUT  */
    /*                       01234567   01234567 */
    char *patterns[][2] = {{"SIMPLE",  "ZSIMPLE" },  
			   {"XTENSION", "ZTENSION" },
			   {"BITPIX",  "ZBITPIX" },
			   {"NAXIS",   "ZNAXIS"  },
			   {"NAXISm",  "ZNAXISm" },
			   {"EXTEND",  "ZEXTEND" },
			   {"BLOCKED", "ZBLOCKED"},
			   {"PCOUNT",  "ZPCOUNT" },  
			   {"GCOUNT",  "ZGCOUNT" },

			   {"CHECKSUM","ZHECKSUM"},  /* save original checksums */
			   {"DATASUM", "ZDATASUM"},
			   
			   {"*",       "+"       }}; /* copy all other keywords */
    int npat;

    if (*status > 0)
        return(*status);

    /* write a default EXTNAME keyword if it doesn't exist in input file*/
    fits_read_card(infptr, "EXTNAME", card, status);
    
    if (*status) {
       *status = 0;
       strcpy(card, "EXTNAME = 'COMPRESSED_IMAGE'");
       fits_write_record(outfptr, card, status);
    }

    /* copy all the keywords from the input file to the output */
    npat = sizeof(patterns)/sizeof(patterns[0][0])/2;
    fits_translate_keywords(infptr, outfptr, 1, patterns, npat,
			    0, 0, 0, status);


    if ( (outfptr->Fptr)->request_lossy_int_compress != 0) { 

	/* request was made to compress integer images as if they had float pixels. */
	/* If input image has positive bitpix value, then reset the output ZBITPIX */
	/* value to -32. */

	fits_read_key(infptr, TINT, "BITPIX", &bitpix, NULL, status);

	if (*status <= 0 && bitpix > 0) {
	    fits_modify_key_lng(outfptr, "ZBITPIX", -32, NULL, status);

	    /* also delete the BSCALE, BZERO, and BLANK keywords */
	    tstatus = 0;
	    fits_delete_key(outfptr, "BSCALE", &tstatus);
	    tstatus = 0;
	    fits_delete_key(outfptr, "BZERO", &tstatus);
	    tstatus = 0;
	    fits_delete_key(outfptr, "BLANK", &tstatus);
	}
    }

   /*
     For compatibility with software that uses an older version of CFITSIO,
     we must make certain that the new ZQUANTIZ keyword, if it exists, must
     occur after the other peudo-required keywords (e.g., ZSIMPLE, ZBITPIX,
     etc.).  Do this by trying to delete the keyword.  If that succeeds (and
     thus the keyword did exist) then rewrite the keyword at the end of header.
     In principle this should not be necessary once all software has upgraded
     to a newer version of CFITSIO (version number greater than 3.181, newer
     than August 2009).
     
     Do the same for the new ZDITHER0 keyword.
   */

   tstatus = 0;
   if (fits_read_card(outfptr, "ZQUANTIZ", card, &tstatus) == 0)
   {
        fits_delete_key(outfptr, "ZQUANTIZ", status);

        /* rewrite the deleted keyword at the end of the header */
        fits_write_record(outfptr, card, status);

	/* write some associated HISTORY keywords */
        fits_parse_value(card, card2, NULL, status);
	if (fits_strncasecmp(card2, "'NONE", 5) ) {
	    /* the value is not 'NONE' */	
	    fits_write_history(outfptr, 
	        "Image was compressed by CFITSIO using scaled integer quantization:", status);
	    snprintf(card2, FLEN_CARD,"  q = %f / quantized level scaling parameter", 
	        (outfptr->Fptr)->request_quantize_level);
	    fits_write_history(outfptr, card2, status); 
	    fits_write_history(outfptr, card+10, status); 
	}
   }

   tstatus = 0;
   if (fits_read_card(outfptr, "ZDITHER0", card, &tstatus) == 0)
   {
        fits_delete_key(outfptr, "ZDITHER0", status);

        /* rewrite the deleted keyword at the end of the header */
        fits_write_record(outfptr, card, status);
   }


    ffghsp(infptr, &nkeys, &nmore, status); /* get number of keywords in image */

    nmore = nmore / 36;  /* how many completely empty header blocks are there? */
     
     /* preserve the same number of spare header blocks in the output header */
     
    for (jj = 0; jj < nmore; jj++)
       for (ii = 0; ii < 36; ii++)
          fits_write_record(outfptr, "    ", status);

    return (*status);
}